

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::on_dynamic_width<fmt::v6::basic_string_view<char>>
          (specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,basic_string_view<char> arg_id)

{
  basic_string_view<char> arg_id_00;
  int iVar1;
  specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDX;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  arg_id_00.size_ = in_stack_ffffffffffffffd0;
  arg_id_00.data_ = in_stack_ffffffffffffffc8;
  specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::get_arg(in_RDX,arg_id_00);
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
  error_handler((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
                 *)in_RDI[2]);
  iVar1 = get_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>,fmt::v6::internal::error_handler>
                    ();
  *(int *)*in_RDI = iVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void on_dynamic_width(Id arg_id) {
    this->specs_.width = get_dynamic_spec<width_checker>(
        get_arg(arg_id), context_.error_handler());
  }